

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

wchar_t archive_entry_update_hardlink_utf8(archive_entry *entry,char *target)

{
  wchar_t wVar1;
  int *piVar2;
  
  wVar1 = entry->ae_set;
  if (target == (char *)0x0) {
    if ((wVar1 & 2U) != 0) {
      return L'\0';
    }
    wVar1 = wVar1 & 0xfffffffc;
  }
  else {
    wVar1 = wVar1 | 1;
  }
  entry->ae_set = wVar1;
  wVar1 = archive_mstring_update_utf8(entry->archive,&entry->ae_linkname,target);
  if (wVar1 != L'\0') {
    piVar2 = __errno_location();
    if (*piVar2 != 0xc) {
      return L'\0';
    }
    __archive_errx(1,"No memory");
  }
  return L'\x01';
}

Assistant:

int
archive_entry_update_hardlink_utf8(struct archive_entry *entry, const char *target)
{
	if (target == NULL && (entry->ae_set & AE_SET_SYMLINK))
		return (0);
	if (target != NULL)
		entry->ae_set |= AE_SET_HARDLINK;
	else
		entry->ae_set &= ~AE_SET_HARDLINK;
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_linkname, target) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}